

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion.cpp
# Opt level: O3

void __thiscall
iu_DISABLED_TestFailure_x_iutest_x_GE_Test::Body(iu_DISABLED_TestFailure_x_iutest_x_GE_Test *this)

{
  float b;
  float a;
  AssertionResult iutest_ar;
  float *in_stack_fffffffffffffe08;
  float local_1f0;
  char local_1ec [4];
  AssertionResult local_1e8;
  AssertionHelper local_1c0;
  undefined1 local_190 [392];
  
  local_1ec[0] = -0x33;
  local_1ec[1] = -0x34;
  local_1ec[2] = -0x34;
  local_1ec[3] = '=';
  local_1f0 = 1.0;
  iutest::internal::CmpHelperOpFailure<float,float>
            (&local_1e8,(internal *)0x1f911e,"b",">=",local_1ec,&local_1f0,in_stack_fffffffffffffe08
            );
  if (local_1e8.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,local_1e8.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffe0f);
    local_1c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/assertion.cpp"
    ;
    local_1c0.m_part_result.super_iuCodeMessage.m_line = 0x13f;
    local_1c0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c0,(Fixed *)local_190,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_message._M_dataplus._M_p != &local_1e8.m_message.field_2) {
    operator_delete(local_1e8.m_message._M_dataplus._M_p,
                    local_1e8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(DISABLED_TestFailure, GE)
{
    float a = 0.1f, b = 1.0f;
    IUTEST_ASSERT_GE(a, b);
}